

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockwidget.cpp
# Opt level: O3

int __thiscall QDockWidgetLayout::titleHeight(QDockWidgetLayout *this)

{
  char cVar1;
  ulong uVar2;
  int iVar3;
  int iVar4;
  QWidget *this_00;
  undefined4 extraout_var;
  ulong uVar6;
  QLayoutItem **ppQVar7;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined8 uVar8;
  QStyle *pQVar9;
  int iVar10;
  undefined8 uVar11;
  long in_FS_OFFSET;
  bool bVar12;
  QFontMetrics titleFontMetrics;
  undefined1 *local_40;
  long local_38;
  long *plVar5;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QLayout::parentWidget(&this->super_QLayout);
  this_00 = (QWidget *)QMetaObject::cast((QObject *)&QDockWidget::staticMetaObject);
  ppQVar7 = (this->item_list).d.ptr;
  if (ppQVar7[3] != (QLayoutItem *)0x0) {
    iVar3 = (*ppQVar7[3]->_vptr_QLayoutItem[0xd])();
    plVar5 = (long *)CONCAT44(extraout_var,iVar3);
    if (plVar5 != (long *)0x0) {
      cVar1 = (this->super_QLayout).super_QLayoutItem.field_0xc;
      uVar6 = (**(code **)(*plVar5 + 0x70))(plVar5);
      uVar2 = uVar6 >> 0x20;
      if (cVar1 != '\0') {
        uVar2 = uVar6;
      }
      iVar3 = (int)uVar2;
      goto LAB_003fe826;
    }
    ppQVar7 = (this->item_list).d.ptr;
  }
  uVar8 = 0;
  uVar11 = 0;
  iVar3 = 0;
  if (ppQVar7[1] != (QLayoutItem *)0x0) {
    iVar3 = (*ppQVar7[1]->_vptr_QLayoutItem[0xd])();
    uVar11 = (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar3) + 0x70))
                       ((long *)CONCAT44(extraout_var_00,iVar3));
    iVar3 = (int)((ulong)uVar11 >> 0x20);
    ppQVar7 = (this->item_list).d.ptr;
  }
  iVar4 = 0;
  if (ppQVar7[2] != (QLayoutItem *)0x0) {
    iVar4 = (*ppQVar7[2]->_vptr_QLayoutItem[0xd])();
    uVar8 = (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar4) + 0x70))
                      ((long *)CONCAT44(extraout_var_01,iVar4));
    iVar4 = (int)((ulong)uVar8 >> 0x20);
  }
  bVar12 = (this->super_QLayout).super_QLayoutItem.field_0xc != '\0';
  if (bVar12) {
    iVar3 = (int)uVar11;
  }
  iVar10 = (int)uVar8;
  if (!bVar12) {
    iVar10 = iVar4;
  }
  if (iVar10 < iVar3) {
    iVar10 = iVar3;
  }
  local_40 = &DAT_aaaaaaaaaaaaaaaa;
  QFontMetrics::QFontMetrics((QFontMetrics *)&local_40,&this_00->data->fnt);
  pQVar9 = QWidget::style(this_00);
  iVar3 = (**(code **)(*(long *)pQVar9 + 0xe0))(pQVar9,0x46,0,this_00);
  iVar4 = QFontMetrics::height();
  iVar4 = iVar4 + iVar3 * 2;
  iVar3 = iVar10 + 2;
  if (iVar10 + 2 <= iVar4) {
    iVar3 = iVar4;
  }
  QFontMetrics::~QFontMetrics((QFontMetrics *)&local_40);
LAB_003fe826:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return iVar3;
  }
  __stack_chk_fail();
}

Assistant:

int QDockWidgetLayout::titleHeight() const
{
    QDockWidget *q = qobject_cast<QDockWidget*>(parentWidget());

    if (QWidget *title = widgetForRole(TitleBar))
        return perp(verticalTitleBar, title->sizeHint());

    QSize closeSize(0, 0);
    QSize floatSize(0, 0);
    if (QLayoutItem *item = item_list[CloseButton])
        closeSize = item->widget()->sizeHint();
    if (QLayoutItem *item = item_list[FloatButton])
        floatSize = item->widget()->sizeHint();

    int buttonHeight = qMax(perp(verticalTitleBar, closeSize),
                            perp(verticalTitleBar, floatSize));

    QFontMetrics titleFontMetrics = q->fontMetrics();
    int mw = q->style()->pixelMetric(QStyle::PM_DockWidgetTitleMargin, nullptr, q);

    return qMax(buttonHeight + 2, titleFontMetrics.height() + 2*mw);
}